

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::FIShortDecoder::decode(FIShortDecoder *this,uint8_t *data,size_t len)

{
  ushort uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  DeadlyImportError *this_00;
  ulong in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  size_t i;
  ulong uVar3;
  shared_ptr<const_Assimp::FIValue> sVar4;
  int16_t v;
  undefined6 uStack_56;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  vector<short,_std::allocator<short>_> value;
  
  if ((in_RCX & 1) == 0) {
    value.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    value.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    value.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<short,_std::allocator<short>_>::reserve(&value,in_RCX >> 1);
    for (uVar3 = 0; in_RCX >> 1 != uVar3; uVar3 = uVar3 + 1) {
      uVar1 = *(ushort *)(len + uVar3 * 2);
      v = uVar1 << 8 | uVar1 >> 8;
      std::vector<short,_std::allocator<short>_>::push_back(&value,&v);
    }
    FIShortValue::create((vector<short,_std::allocator<short>_> *)&v);
    _Var2._M_pi = _Stack_50._M_pi;
    _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *this = _v;
    this[1] = (FIShortDecoder)_Var2._M_pi;
    _v = (FIShortDecoder)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
    std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
              (&value.super__Vector_base<short,_std::allocator<short>_>);
    sVar4.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar4.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<const_Assimp::FIValue>)
           sVar4.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  DeadlyImportError::DeadlyImportError(this_00,(string *)parseErrorMessage_abi_cxx11_);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        if (len & 1) {
            throw DeadlyImportError(parseErrorMessage);
        }
        std::vector<int16_t> value;
        size_t numShorts = len / 2;
        value.reserve(numShorts);
        for (size_t i = 0; i < numShorts; ++i) {
            int16_t v = (data[0] << 8) | data[1];
            value.push_back(v);
            data += 2;
        }
        return FIShortValue::create(std::move(value));
    }